

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementBeamTaperedTimoshenko.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChElementBeamTaperedTimoshenko::ComputeNF
          (ChElementBeamTaperedTimoshenko *this,double U,ChVectorDynamic<> *Qi,double *detJ,
          ChVectorDynamic<> *F,ChVectorDynamic<> *state_x,ChVectorDynamic<> *state_w)

{
  ShapeFunctionGroup NN;
  ShapeFunctionN N;
  undefined1 *local_6d8;
  Product<Eigen::Transpose<Eigen::Matrix<double,_6,_12,_1,_6,_12>_>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>
  local_6d0;
  ShapeFunctionGroup local_6c0;
  undefined1 local_2c0 [656];
  
  ShapeFunctionsTimoshenko(this,&local_6c0,U);
  memcpy(local_2c0,
         &local_6c0.
          super__Tuple_impl<0UL,_Eigen::Matrix<double,_6,_12,_1,_6,_12>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
          .super__Head_base<0UL,_Eigen::Matrix<double,_6,_12,_1,_6,_12>,_false>,0x240);
  *detJ = (this->super_ChElementBeam).length * 0.5;
  local_6d8 = local_2c0;
  local_6d0 = Eigen::MatrixBase<Eigen::Transpose<Eigen::Matrix<double,6,12,1,6,12>>>::operator*
                        ((MatrixBase<Eigen::Transpose<Eigen::Matrix<double,6,12,1,6,12>>> *)
                         &local_6d8,(MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)F);
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,6,12,1,6,12>>,Eigen::Matrix<double,_1,1,0,_1,1>,0>>
            (Qi,&local_6d0);
  return;
}

Assistant:

void ChElementBeamTaperedTimoshenko::ComputeNF(const double U,
                                               ChVectorDynamic<>& Qi,
                                               double& detJ,
                                               const ChVectorDynamic<>& F,
                                               ChVectorDynamic<>* state_x,
                                               ChVectorDynamic<>* state_w) {
    ShapeFunctionGroup NN;
    ShapeFunctionsTimoshenko(NN, U);
    ShapeFunctionN N = std::get<0>(NN);

    // eta = 2*x/L;
    // ---> Deta/dx = 2./L;
    // ---> detJ = dx/Deta = L/2.;
    detJ = this->GetRestLength() / 2.0;

    Qi = N.transpose() * F;
}